

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

bool __thiscall testing::internal::UnitTestImpl::Passed(UnitTestImpl *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = failed_test_case_count(this);
  if (iVar2 < 1) {
    bVar1 = TestResult::Failed(&this->ad_hoc_test_result_);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Passed() const { return !Failed(); }